

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(wasm::LocalSet__
          (void *this,LocalSet *curr)

{
  Index index;
  Expression *pEVar1;
  ulong uVar2;
  undefined1 *puVar3;
  LocalSet *left;
  Block *expression;
  ulong uVar4;
  ulong uVar5;
  Expression *value;
  Expression *pEVar6;
  bool bVar7;
  optional<wasm::Type> type;
  Builder local_38;
  Builder builder;
  
  uVar5 = *(ulong *)(*(long *)((long)this + 0xd8) + 0x10);
  if (uVar5 != 0) {
    uVar4 = *(long *)((long)this + 0xd8) + 8;
    uVar2 = uVar4;
    do {
      bVar7 = *(LocalSet **)(uVar5 + 0x20) < curr;
      if (!bVar7) {
        uVar2 = uVar5;
      }
      uVar5 = *(ulong *)(uVar5 + 0x10 + (ulong)bVar7 * 8);
    } while (uVar5 != 0);
    if ((uVar2 != uVar4) && (*(LocalSet **)(uVar2 + 0x20) <= curr)) {
      pEVar1 = curr->value;
      if (pEVar1->_id != BinaryId) {
        __assert_fail("int(_id) == int(T::SpecificId)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                      ,0x31b,"T *wasm::Expression::cast() [T = wasm::Binary]");
      }
      index = *(Index *)(uVar2 + 0x28);
      value = (Expression *)pEVar1[1].type.id;
      if (value->_id == ConstId) {
        pEVar6 = pEVar1 + 2;
        value = *(Expression **)(pEVar1 + 2);
      }
      else {
        if ((*(Expression **)(pEVar1 + 2))->_id != ConstId) {
          __assert_fail("binary->right->is<Const>()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeAddedConstants.cpp"
                        ,0x1b0,
                        "void wasm::OptimizeAddedConstants::createHelperIndexes()::Creator::visitLocalSet(LocalSet *)"
                       );
        }
        pEVar6 = (Expression *)&pEVar1[1].type;
      }
      local_38.wasm = *(Module **)((long)this + 0xe0);
      puVar3 = (undefined1 *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x18,8);
      *puVar3 = 8;
      *(Index *)(puVar3 + 0x10) = index;
      *(undefined8 *)(puVar3 + 8) = 2;
      *(undefined1 **)pEVar6 = puVar3;
      left = Builder::makeLocalSet(&local_38,index,value);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar4;
      expression = Builder::makeSequence(&local_38,(Expression *)left,(Expression *)curr,type);
      Walker<Creator,_wasm::Visitor<Creator,_void>_>::replaceCurrent
                ((Walker<Creator,_wasm::Visitor<Creator,_void>_> *)this,(Expression *)expression);
    }
  }
  return;
}

Assistant:

void visitLocalSet(LocalSet* curr) {
        auto iter = helperIndexes.find(curr);
        if (iter != helperIndexes.end()) {
          auto index = iter->second;
          auto* binary = curr->value->cast<Binary>();
          Expression** target;
          if (binary->left->is<Const>()) {
            target = &binary->right;
          } else {
            assert(binary->right->is<Const>());
            target = &binary->left;
          }
          auto* value = *target;
          Builder builder(*module);
          *target = builder.makeLocalGet(index, Type::i32);
          replaceCurrent(
            builder.makeSequence(builder.makeLocalSet(index, value), curr));
        }
      }